

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::removeItem(QGraphicsScene *this,QGraphicsItem *item)

{
  QGraphicsScenePrivate *this_00;
  QGraphicsScene *pQVar1;
  QGraphicsScene *pQVar2;
  long in_FS_OFFSET;
  QGraphicsScene *local_a0;
  QVariant local_98;
  enable_if_t<std::conjunction_v<std::is_copy_constructible<QGraphicsScene_*>,_std::is_destructible<QGraphicsScene_*>_>,_QVariant>
  local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *pcStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    local_58._0_4_ = 2;
    local_58._20_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    pcStack_40 = "default";
    QMessageLogger::warning
              ((char *)local_58.data,"QGraphicsScene::removeItem: cannot remove 0-item");
  }
  else {
    this_00 = *(QGraphicsScenePrivate **)(this + 8);
    pQVar1 = (QGraphicsScene *)QGraphicsItem::scene(item);
    if (pQVar1 == this) {
      local_58._16_4_ = 0xaaaaaaaa;
      local_58._20_4_ = 0xaaaaaaaa;
      pcStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58._0_4_ = 0xaaaaaaaa;
      local_58._4_4_ = 0xaaaaaaaa;
      local_58._8_4_ = 0xaaaaaaaa;
      local_58._12_4_ = 0xaaaaaaaa;
      local_a0 = (QGraphicsScene *)0x0;
      ::QVariant::fromValue<QGraphicsScene_*,_true>(&local_78,&local_a0);
      (*item->_vptr_QGraphicsItem[0x21])(&local_58,item,0xb,&local_78);
      ::QVariant::~QVariant(&local_78);
      pQVar1 = (QGraphicsScene *)qvariant_cast<QGraphicsScene*>((QVariant *)&local_58);
      if (pQVar1 == this || pQVar1 == (QGraphicsScene *)0x0) {
        QGraphicsScenePrivate::removeItemHelper(this_00,item);
        (*item->_vptr_QGraphicsItem[0x21])(&local_98,item,0x10,&local_58);
        ::QVariant::~QVariant(&local_98);
        QGraphicsScenePrivate::updateInputMethodSensitivityInViews(this_00);
      }
      else {
        addItem(pQVar1,item);
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      local_58._0_4_ = 2;
      local_58._20_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_4_ = 0;
      local_58._12_4_ = 0;
      local_58._16_4_ = 0;
      pcStack_40 = "default";
      pQVar2 = QGraphicsItem::scene(item);
      QMessageLogger::warning
                ((char *)local_58.data,
                 "QGraphicsScene::removeItem: item %p\'s scene (%p) is different from this scene (%p)"
                 ,item,pQVar2,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::removeItem(QGraphicsItem *item)
{
    // ### Refactoring: This function shares much functionality with _q_removeItemLater()
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::removeItem: cannot remove 0-item");
        return;
    }
    if (item->scene() != this) {
        qWarning("QGraphicsScene::removeItem: item %p's scene (%p)"
                 " is different from this scene (%p)",
                 item, item->scene(), this);
        return;
    }

    // Notify the item that it's scene is changing to 0, allowing the item to
    // react.
    const QVariant newSceneVariant(item->itemChange(QGraphicsItem::ItemSceneChange,
                                                    QVariant::fromValue<QGraphicsScene *>(0)));
    QGraphicsScene *targetScene = qvariant_cast<QGraphicsScene *>(newSceneVariant);
    if (targetScene != nullptr && targetScene != this) {
        targetScene->addItem(item);
        return;
    }

    d->removeItemHelper(item);

    // Deliver post-change notification
    item->itemChange(QGraphicsItem::ItemSceneHasChanged, newSceneVariant);

    d->updateInputMethodSensitivityInViews();
}